

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5PutU64(u8 *a,u64 iVal)

{
  u64 iVal_local;
  u8 *a_local;
  
  *a = (u8)(iVal >> 0x38);
  a[1] = (u8)(iVal >> 0x30);
  a[2] = (u8)(iVal >> 0x28);
  a[3] = (u8)(iVal >> 0x20);
  a[4] = (u8)(iVal >> 0x18);
  a[5] = (u8)(iVal >> 0x10);
  a[6] = (u8)(iVal >> 8);
  a[7] = (u8)iVal;
  return;
}

Assistant:

static void fts5PutU64(u8 *a, u64 iVal){
  a[0] = ((iVal >> 56) & 0xFF);
  a[1] = ((iVal >> 48) & 0xFF);
  a[2] = ((iVal >> 40) & 0xFF);
  a[3] = ((iVal >> 32) & 0xFF);
  a[4] = ((iVal >> 24) & 0xFF);
  a[5] = ((iVal >> 16) & 0xFF);
  a[6] = ((iVal >>  8) & 0xFF);
  a[7] = ((iVal >>  0) & 0xFF);
}